

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

void nn_node_dump(nn_trie_node *self,int indent)

{
  undefined4 in_ESI;
  uint *in_RDI;
  int children;
  int i;
  uint uVar1;
  uint uVar2;
  
  if (in_RDI == (uint *)0x0) {
    nn_node_indent(0);
    printf("NULL\n");
  }
  else {
    nn_node_indent(0);
    printf("===================\n");
    nn_node_indent(0);
    printf("refcount=%d\n",(ulong)*in_RDI);
    nn_node_indent(0);
    printf("prefix_len=%d\n",(ulong)*(byte *)((long)in_RDI + 5));
    nn_node_indent(0);
    if ((char)in_RDI[1] == '\t') {
      printf("type=dense\n");
    }
    else {
      printf("type=sparse\n");
    }
    nn_node_indent(0);
    printf("prefix=\"");
    for (uVar1 = 0; uVar1 != *(byte *)((long)in_RDI + 5); uVar1 = uVar1 + 1) {
      nn_node_putchar('\0');
    }
    printf("\"\n");
    if ((byte)in_RDI[1] < 9) {
      nn_node_indent(0);
      printf("sparse.children=\"");
      for (uVar1 = 0; uVar1 != (byte)in_RDI[1]; uVar1 = uVar1 + 1) {
        nn_node_putchar('\0');
      }
      printf("\"\n");
      uVar1 = (uint)(byte)in_RDI[1];
    }
    else {
      nn_node_indent(0);
      printf("dense.min=\'%c\' (%d)\n",(ulong)(uint)(int)(char)in_RDI[4],(ulong)(byte)in_RDI[4]);
      nn_node_indent(0);
      printf("dense.max=\'%c\' (%d)\n",(ulong)(uint)(int)*(char *)((long)in_RDI + 0x11),
             (ulong)*(byte *)((long)in_RDI + 0x11));
      nn_node_indent(0);
      printf("dense.nbr=%d\n",(ulong)*(ushort *)((long)in_RDI + 0x12));
      uVar1 = ((uint)*(byte *)((long)in_RDI + 0x11) - (uint)(byte)in_RDI[4]) + 1;
    }
    for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      nn_node_dump((nn_trie_node *)CONCAT44(in_ESI,uVar2),uVar1);
    }
    nn_node_indent(0);
    printf("===================\n");
  }
  return;
}

Assistant:

void nn_node_dump (struct nn_trie_node *self, int indent)
{
    int i;
    int children;

    if (!self) {
        nn_node_indent (indent);
        printf ("NULL\n");
        return;
    }

    nn_node_indent (indent);
    printf ("===================\n");
    nn_node_indent (indent);
    printf ("refcount=%d\n", (int) self->refcount);
    nn_node_indent (indent);
    printf ("prefix_len=%d\n", (int) self->prefix_len);
    nn_node_indent (indent);
    if (self->type == NN_TRIE_DENSE_TYPE)
        printf ("type=dense\n");
    else
        printf ("type=sparse\n");
    nn_node_indent (indent);
    printf ("prefix=\"");
    for (i = 0; i != self->prefix_len; ++i)
        nn_node_putchar (self->prefix [i]);
    printf ("\"\n");
    if (self->type <= 8) {
        nn_node_indent (indent);
        printf ("sparse.children=\"");
        for (i = 0; i != self->type; ++i)
            nn_node_putchar (self->u.sparse.children [i]);
        printf ("\"\n");
        children = self->type;
    }
    else {
        nn_node_indent (indent);
        printf ("dense.min='%c' (%d)\n", (char) self->u.dense.min,
            (int) self->u.dense.min);
        nn_node_indent (indent);
        printf ("dense.max='%c' (%d)\n", (char) self->u.dense.max,
            (int) self->u.dense.max);
        nn_node_indent (indent);
        printf ("dense.nbr=%d\n", (int) self->u.dense.nbr);
        children = self->u.dense.max - self->u.dense.min + 1;
    }

    for (i = 0; i != children; ++i)
        nn_node_dump (((struct nn_trie_node**) (self + 1)) [i], indent + 1);

    nn_node_indent (indent);
    printf ("===================\n");
}